

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O0

int ppc_hash64_handle_mmu_fault(PowerPCCPU_conflict3 *cpu,vaddr eaddr,int rwx,int mmu_idx)

{
  ppc_hash_pte64_t pte_00;
  ppc_hash_pte64_t pte_01;
  ppc_hash_pte64_t pte_02;
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  target_ulong tVar5;
  uint64_t uVar6;
  uint local_b8;
  uint local_b4;
  int dsisr_2;
  int srr1;
  int dsisr_1;
  int dsisr;
  target_ulong limit;
  hwaddr raddr;
  int need_prot [3];
  int prot;
  int amr_prot;
  int pp_prot;
  int exec_prot;
  ppc_hash_pte64_t pte;
  hwaddr ptex;
  ppc_slb_t *ppStack_58;
  uint apshift;
  ppc_slb_t *slb;
  ppc_slb_t vrma_slbe;
  CPUPPCState_conflict2 *env;
  CPUState *cs;
  int mmu_idx_local;
  int rwx_local;
  vaddr eaddr_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  vrma_slbe.sps = (PPCHash64SegmentPageSizes *)&cpu->env;
  stack0xffffffffffffff6c = 0x200000001;
  need_prot[0] = 4;
  if (((rwx != 0) && (rwx != 1)) && (rwx != 2)) {
    __assert_fail("(rwx == 0) || (rwx == 1) || (rwx == 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                  ,0x389,"int ppc_hash64_handle_mmu_fault(PowerPCCPU *, vaddr, int, int)");
  }
  if (((rwx == 2) && (((cpu->env).msr >> 5 & 1) == 0)) ||
     ((rwx != 2 && (((cpu->env).msr >> 4 & 1) == 0)))) {
    limit = eaddr & 0xfffffffffffffff;
    if ((((cpu->env).msr >> 0x3c & 1) == 0) && (((cpu->env).has_hv_mode & 1U) != 0)) {
      _Var1 = ppc_hash64_use_vrma((CPUPPCState_conflict2 *)vrma_slbe.sps);
      if (_Var1) {
        ppStack_58 = (ppc_slb_t *)&slb;
        iVar2 = build_vrma_slbe(cpu,ppStack_58);
        if (iVar2 != 0) {
          (cpu->parent_obj).exception_index = 1;
          vrma_slbe.sps[0x437].enc[4].page_shift = 0;
          return 1;
        }
        goto LAB_01029ea8;
      }
      tVar5 = rmls_limit(cpu);
      if (tVar5 <= limit) {
        if (rwx == 2) {
          ppc_hash64_set_isi(&cpu->parent_obj,0x8000000);
        }
        else {
          srr1 = 0x8000000;
          if (rwx == 1) {
            srr1 = 0xa000000;
          }
          ppc_hash64_set_dsi(&cpu->parent_obj,eaddr,(long)srr1);
        }
        return 1;
      }
      limit = (ulong)vrma_slbe.sps[0x4a].enc[0] | limit;
    }
    else if (-1 < (long)eaddr) {
      limit = (cpu->env).spr[0x139] | limit;
    }
    tlb_set_page_ppc64(&cpu->parent_obj,eaddr & 0xfffffffffffff000,limit & 0xfffffffffffff000,7,
                       mmu_idx,0x1000);
    cpu_local._4_4_ = 0;
  }
  else {
    ppStack_58 = slb_lookup(cpu,eaddr);
    if (ppStack_58 == (ppc_slb_t *)0x0) {
      _Var1 = ppc64_use_proc_tbl(cpu);
      if (!_Var1) {
        if (rwx == 2) {
          (cpu->parent_obj).exception_index = 0x42;
          vrma_slbe.sps[0x437].enc[4].page_shift = 0;
        }
        else {
          (cpu->parent_obj).exception_index = 0x41;
          vrma_slbe.sps[0x437].enc[4].page_shift = 0;
          vrma_slbe.sps[0x29].enc[4].page_shift = (int)eaddr;
          vrma_slbe.sps[0x29].enc[4].pte_enc = (int)(eaddr >> 0x20);
        }
        return 1;
      }
      fprintf(_stderr,"Segment Table Support Unimplemented");
      exit(1);
    }
LAB_01029ea8:
    if ((rwx == 2) && ((ppStack_58->vsid & 0x200) != 0)) {
      ppc_hash64_set_isi(&cpu->parent_obj,0x10000000);
      cpu_local._4_4_ = 1;
    }
    else {
      pte.pte1 = ppc_hash64_htab_lookup
                           (cpu,ppStack_58,eaddr,(ppc_hash_pte64_t *)&pp_prot,
                            (uint *)((long)&ptex + 4));
      if (pte.pte1 == 0xffffffffffffffff) {
        if (rwx == 2) {
          ppc_hash64_set_isi(&cpu->parent_obj,0x40000000);
        }
        else {
          dsisr_2 = 0x40000000;
          if (rwx == 1) {
            dsisr_2 = 0x42000000;
          }
          ppc_hash64_set_dsi(&cpu->parent_obj,eaddr,(long)dsisr_2);
        }
        cpu_local._4_4_ = 1;
      }
      else {
        pte_00.pte1 = pte.pte0;
        pte_00.pte0 = _pp_prot;
        uVar3 = ppc_hash64_pte_noexec_guard(cpu,pte_00);
        pte_01.pte1 = pte.pte0;
        pte_01.pte0 = _pp_prot;
        uVar4 = ppc_hash64_pte_prot(cpu,ppStack_58,pte_01);
        pte_02.pte1 = pte.pte0;
        pte_02.pte0 = _pp_prot;
        need_prot[2] = ppc_hash64_amr_prot(cpu,pte_02);
        need_prot[1] = uVar3 & uVar4 & need_prot[2];
        if ((*(uint *)((long)&raddr + (long)rwx * 4 + 4) & (need_prot[1] ^ 0xffffffffU)) == 0) {
          if ((pte.pte0 & 0x100) == 0) {
            ppc_hash64_set_r(cpu,pte.pte1,pte.pte0);
          }
          if ((pte.pte0 & 0x80) == 0) {
            if (rwx == 1) {
              ppc_hash64_set_c(cpu,pte.pte1,pte.pte0);
            }
            else {
              need_prot[1] = need_prot[1] & 0xfffffffd;
            }
          }
          uVar6 = deposit64(pte.pte0 & 0xffffffffffff000,0,ptex._4_4_,eaddr);
          tlb_set_page_ppc64(&cpu->parent_obj,eaddr & 0xfffffffffffff000,uVar6 & 0xfffffffffffff000,
                             need_prot[1],mmu_idx,1L << ((byte)ptex._4_4_ & 0x3f));
          cpu_local._4_4_ = 0;
        }
        else {
          if (rwx == 2) {
            local_b4 = 0;
            if (((uVar3 ^ 0xffffffff) & 4) == 0) {
              if (((uVar4 ^ 0xffffffff) & 4) != 0) {
                local_b4 = 0x8000000;
              }
            }
            else {
              local_b4 = 0x10000000;
            }
            if (((need_prot[2] ^ 0xffffffffU) & 4) != 0) {
              local_b4 = local_b4 | 0x200000;
            }
            ppc_hash64_set_isi(&cpu->parent_obj,(long)(int)local_b4);
          }
          else {
            local_b8 = 0;
            if ((*(uint *)((long)&raddr + (long)rwx * 4 + 4) & (uVar4 ^ 0xffffffff)) != 0) {
              local_b8 = 0x8000000;
            }
            if (rwx == 1) {
              local_b8 = local_b8 | 0x2000000;
            }
            if ((*(uint *)((long)&raddr + (long)rwx * 4 + 4) & (need_prot[2] ^ 0xffffffffU)) != 0) {
              local_b8 = local_b8 | 0x200000;
            }
            ppc_hash64_set_dsi(&cpu->parent_obj,eaddr,(long)(int)local_b8);
          }
          cpu_local._4_4_ = 1;
        }
      }
    }
  }
  return cpu_local._4_4_;
}

Assistant:

int ppc_hash64_handle_mmu_fault(PowerPCCPU *cpu, vaddr eaddr,
                                int rwx, int mmu_idx)
{
    CPUState *cs = CPU(cpu);
    CPUPPCState *env = &cpu->env;
    ppc_slb_t vrma_slbe;
    ppc_slb_t *slb;
    unsigned apshift;
    hwaddr ptex;
    ppc_hash_pte64_t pte;
    int exec_prot, pp_prot, amr_prot, prot;
    const int need_prot[] = {PAGE_READ, PAGE_WRITE, PAGE_EXEC};
    hwaddr raddr;

    assert((rwx == 0) || (rwx == 1) || (rwx == 2));

    /*
     * Note on LPCR usage: 970 uses HID4, but our special variant of
     * store_spr copies relevant fields into env->spr[SPR_LPCR].
     * Similarily we filter unimplemented bits when storing into LPCR
     * depending on the MMU version. This code can thus just use the
     * LPCR "as-is".
     */

    /* 1. Handle real mode accesses */
    if (((rwx == 2) && (msr_ir == 0)) || ((rwx != 2) && (msr_dr == 0))) {
        /*
         * Translation is supposedly "off", but in real mode the top 4
         * effective address bits are (mostly) ignored
         */
        raddr = eaddr & 0x0FFFFFFFFFFFFFFFULL;

#if 0
        if (cpu->vhyp) {
            /*
             * In virtual hypervisor mode, there's nothing to do:
             *   EA == GPA == qemu guest address
             */
        } else
#endif
        if (msr_hv || !env->has_hv_mode) {
            /* In HV mode, add HRMOR if top EA bit is clear */
            if (!(eaddr >> 63)) {
                raddr |= env->spr[SPR_HRMOR];
            }
        } else if (ppc_hash64_use_vrma(env)) {
            /* Emulated VRMA mode */
            slb = &vrma_slbe;
            if (build_vrma_slbe(cpu, slb) != 0) {
                /* Invalid VRMA setup, machine check */
                cs->exception_index = POWERPC_EXCP_MCHECK;
                env->error_code = 0;
                return 1;
            }

            goto skip_slb_search;
        } else {
            target_ulong limit = rmls_limit(cpu);

            /* Emulated old-style RMO mode, bounds check against RMLS */
            if (raddr >= limit) {
                if (rwx == 2) {
                    ppc_hash64_set_isi(cs, SRR1_PROTFAULT);
                } else {
                    int dsisr = DSISR_PROTFAULT;
                    if (rwx == 1) {
                        dsisr |= DSISR_ISSTORE;
                    }
                    ppc_hash64_set_dsi(cs, eaddr, dsisr);
                }
                return 1;
            }

            raddr |= env->spr[SPR_RMOR];
        }
        tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                     PAGE_READ | PAGE_WRITE | PAGE_EXEC, mmu_idx,
                     TARGET_PAGE_SIZE);
        return 0;
    }

    /* 2. Translation is on, so look up the SLB */
    slb = slb_lookup(cpu, eaddr);
    if (!slb) {
        /* No entry found, check if in-memory segment tables are in use */
        if (ppc64_use_proc_tbl(cpu)) {
            /* TODO - Unsupported */
            fprintf(stderr, "Segment Table Support Unimplemented");
            exit(1);
        }
        /* Segment still not found, generate the appropriate interrupt */
        if (rwx == 2) {
            cs->exception_index = POWERPC_EXCP_ISEG;
            env->error_code = 0;
        } else {
            cs->exception_index = POWERPC_EXCP_DSEG;
            env->error_code = 0;
            env->spr[SPR_DAR] = eaddr;
        }
        return 1;
    }

skip_slb_search:

    /* 3. Check for segment level no-execute violation */
    if ((rwx == 2) && (slb->vsid & SLB_VSID_N)) {
        ppc_hash64_set_isi(cs, SRR1_NOEXEC_GUARD);
        return 1;
    }

    /* 4. Locate the PTE in the hash table */
    ptex = ppc_hash64_htab_lookup(cpu, slb, eaddr, &pte, &apshift);
    if (ptex == -1) {
        if (rwx == 2) {
            ppc_hash64_set_isi(cs, SRR1_NOPTE);
        } else {
            int dsisr = DSISR_NOPTE;
            if (rwx == 1) {
                dsisr |= DSISR_ISSTORE;
            }
            ppc_hash64_set_dsi(cs, eaddr, dsisr);
        }
        return 1;
    }
    qemu_log_mask(CPU_LOG_MMU,
                  "found PTE at index %08" HWADDR_PRIx "\n", ptex);

    /* 5. Check access permissions */

    exec_prot = ppc_hash64_pte_noexec_guard(cpu, pte);
    pp_prot = ppc_hash64_pte_prot(cpu, slb, pte);
    amr_prot = ppc_hash64_amr_prot(cpu, pte);
    prot = exec_prot & pp_prot & amr_prot;

    if ((need_prot[rwx] & ~prot) != 0) {
        /* Access right violation */
        qemu_log_mask(CPU_LOG_MMU, "PTE access rejected\n");
        if (rwx == 2) {
            int srr1 = 0;
            if (PAGE_EXEC & ~exec_prot) {
                srr1 |= SRR1_NOEXEC_GUARD; /* Access violates noexec or guard */
            } else if (PAGE_EXEC & ~pp_prot) {
                srr1 |= SRR1_PROTFAULT; /* Access violates access authority */
            }
            if (PAGE_EXEC & ~amr_prot) {
                srr1 |= SRR1_IAMR; /* Access violates virt pg class key prot */
            }
            ppc_hash64_set_isi(cs, srr1);
        } else {
            int dsisr = 0;
            if (need_prot[rwx] & ~pp_prot) {
                dsisr |= DSISR_PROTFAULT;
            }
            if (rwx == 1) {
                dsisr |= DSISR_ISSTORE;
            }
            if (need_prot[rwx] & ~amr_prot) {
                dsisr |= DSISR_AMR;
            }
            ppc_hash64_set_dsi(cs, eaddr, dsisr);
        }
        return 1;
    }

    qemu_log_mask(CPU_LOG_MMU, "PTE access granted !\n");

    /* 6. Update PTE referenced and changed bits if necessary */

    if (!(pte.pte1 & HPTE64_R_R)) {
        ppc_hash64_set_r(cpu, ptex, pte.pte1);
    }
    if (!(pte.pte1 & HPTE64_R_C)) {
        if (rwx == 1) {
            ppc_hash64_set_c(cpu, ptex, pte.pte1);
        } else {
            /*
             * Treat the page as read-only for now, so that a later write
             * will pass through this function again to set the C bit
             */
            prot &= ~PAGE_WRITE;
        }
    }

    /* 7. Determine the real address from the PTE */

    raddr = deposit64(pte.pte1 & HPTE64_R_RPN, 0, apshift, eaddr);

    tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                 prot, mmu_idx, 1ULL << apshift);

    return 0;
}